

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::EndFrame(void)

{
  ImVector<ImGuiViewport_*> *this;
  ImVector<ImGuiViewportP_*> *this_00;
  ImVector<ImGuiWindow_*> *this_01;
  ImVector<ImGuiWindow_*> *this_02;
  ImVec2 IVar1;
  ImGuiNavLayer IVar2;
  uint move_flags;
  _func_void_ImGuiViewport_ptr_ImGuiPlatformImeData_ptr *p_Var3;
  char *text;
  ImGuiViewportP *pIVar4;
  ImGuiContext *pIVar5;
  ImGuiContext *ctx;
  ImGuiContext *pIVar6;
  bool bVar7;
  bool bVar8;
  ImGuiKeyModFlags IVar9;
  int iVar10;
  ImVec2 in_RAX;
  ImGuiViewport *pIVar11;
  ImGuiWindow *pIVar12;
  ImGuiWindow **ppIVar13;
  char *pcVar14;
  ImVec2 *pIVar15;
  ImGuiViewportP **ppIVar16;
  ImGuiContext *g;
  int i;
  ImGuiDir clip_dir;
  char *label;
  int iVar17;
  float fVar18;
  ImVec2 IVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  ImVec2 local_38;
  
  ctx = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x13b1,"void ImGui::EndFrame()");
  }
  if (GImGui->FrameCountEnded == GImGui->FrameCount) {
    return;
  }
  if (GImGui->WithinFrameScope == false) {
    __assert_fail("g.WithinFrameScope && \"Forgot to call ImGui::NewFrame()?\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x13b6,"void ImGui::EndFrame()");
  }
  local_38 = in_RAX;
  CallContextHooks(GImGui,ImGuiContextHookType_EndFramePre);
  pIVar6 = GImGui;
  IVar9 = GetMergedKeyModFlags();
  if ((IVar9 != 0) && ((pIVar6->IO).KeyMods != IVar9)) {
    __assert_fail("(key_mod_flags == 0 || g.IO.KeyMods == key_mod_flags) && \"Mismatching io.KeyCtrl/io.KeyShift/io.KeyAlt/io.KeySuper vs io.KeyMods\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x21e2,"void ImGui::ErrorCheckEndFrameSanityChecks()");
  }
  iVar17 = (pIVar6->CurrentWindowStack).Size;
  if (iVar17 != 1) {
    if (1 < iVar17) {
      __assert_fail("(g.CurrentWindowStack.Size == 1) && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you forget to call End/EndChild?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                    ,0x21ee,"void ImGui::ErrorCheckEndFrameSanityChecks()");
    }
    __assert_fail("(g.CurrentWindowStack.Size == 1) && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you call End/EndChild too much?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x21f4,"void ImGui::ErrorCheckEndFrameSanityChecks()");
  }
  if ((pIVar6->GroupStack).Size != 0) {
    __assert_fail("(g.GroupStack.Size == 0) && \"Missing EndGroup call!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x21f8,"void ImGui::ErrorCheckEndFrameSanityChecks()");
  }
  if (((ctx->IO).SetPlatformImeDataFn !=
       (_func_void_ImGuiViewport_ptr_ImGuiPlatformImeData_ptr *)0x0) &&
     (auVar22[0] = -((ctx->PlatformImeDataPrev).WantVisible == (ctx->PlatformImeData).WantVisible),
     auVar22[1] = -((ctx->PlatformImeDataPrev).field_0x1 == (ctx->PlatformImeData).field_0x1),
     auVar22[2] = -((ctx->PlatformImeDataPrev).field_0x2 == (ctx->PlatformImeData).field_0x2),
     auVar22[3] = -((ctx->PlatformImeDataPrev).field_0x3 == (ctx->PlatformImeData).field_0x3),
     auVar22[4] = -(*(char *)&(ctx->PlatformImeDataPrev).InputPos.x ==
                   *(char *)&(ctx->PlatformImeData).InputPos.x),
     auVar22[5] = -(*(char *)((long)&(ctx->PlatformImeDataPrev).InputPos.x + 1) ==
                   *(char *)((long)&(ctx->PlatformImeData).InputPos.x + 1)),
     auVar22[6] = -(*(char *)((long)&(ctx->PlatformImeDataPrev).InputPos.x + 2) ==
                   *(char *)((long)&(ctx->PlatformImeData).InputPos.x + 2)),
     auVar22[7] = -(*(char *)((long)&(ctx->PlatformImeDataPrev).InputPos.x + 3) ==
                   *(char *)((long)&(ctx->PlatformImeData).InputPos.x + 3)),
     auVar22[8] = -(*(char *)&(ctx->PlatformImeDataPrev).InputPos.y ==
                   *(char *)&(ctx->PlatformImeData).InputPos.y),
     auVar22[9] = -(*(char *)((long)&(ctx->PlatformImeDataPrev).InputPos.y + 1) ==
                   *(char *)((long)&(ctx->PlatformImeData).InputPos.y + 1)),
     auVar22[10] = -(*(char *)((long)&(ctx->PlatformImeDataPrev).InputPos.y + 2) ==
                    *(char *)((long)&(ctx->PlatformImeData).InputPos.y + 2)),
     auVar22[0xb] = -(*(char *)((long)&(ctx->PlatformImeDataPrev).InputPos.y + 3) ==
                     *(char *)((long)&(ctx->PlatformImeData).InputPos.y + 3)),
     auVar22[0xc] = -(*(char *)&(ctx->PlatformImeDataPrev).InputLineHeight ==
                     *(char *)&(ctx->PlatformImeData).InputLineHeight),
     auVar22[0xd] = -(*(char *)((long)&(ctx->PlatformImeDataPrev).InputLineHeight + 1) ==
                     *(char *)((long)&(ctx->PlatformImeData).InputLineHeight + 1)),
     auVar22[0xe] = -(*(char *)((long)&(ctx->PlatformImeDataPrev).InputLineHeight + 2) ==
                     *(char *)((long)&(ctx->PlatformImeData).InputLineHeight + 2)),
     auVar22[0xf] = -(*(char *)((long)&(ctx->PlatformImeDataPrev).InputLineHeight + 3) ==
                     *(char *)((long)&(ctx->PlatformImeData).InputLineHeight + 3)),
     (ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) | (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe | (ushort)(auVar22[0xf] >> 7) << 0xf)
     != 0xffff)) {
    pIVar11 = FindViewportByID(ctx->PlatformImeViewport);
    p_Var3 = (ctx->IO).SetPlatformImeDataFn;
    if (pIVar11 == (ImGuiViewport *)0x0) {
      pIVar11 = GetMainViewport();
    }
    (*p_Var3)(pIVar11,&ctx->PlatformImeData);
  }
  ctx->WithinFrameScopeWithImplicitWindow = false;
  pIVar12 = ctx->CurrentWindow;
  if ((pIVar12 != (ImGuiWindow *)0x0) && (pIVar12->WriteAccessed == false)) {
    pIVar12->Active = false;
  }
  End();
  pIVar6 = GImGui;
  if ((GImGui->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15)) {
    if (GImGui->NavWindowingListWindow == (ImGuiWindow *)0x0) {
      pIVar12 = FindWindowByName("###NavWindowingList");
      pIVar6->NavWindowingListWindow = pIVar12;
    }
    pIVar11 = GetMainViewport();
    pIVar5 = GImGui;
    IVar19.x = (pIVar11->Size).x * 0.2;
    IVar19.y = (pIVar11->Size).y * 0.2;
    (GImGui->NextWindowData).SizeConstraintRect.Min = IVar19;
    (pIVar5->NextWindowData).SizeConstraintRect.Max.x = 3.4028235e+38;
    (pIVar5->NextWindowData).SizeConstraintRect.Max.y = 3.4028235e+38;
    (pIVar5->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
    (pIVar5->NextWindowData).SizeCallbackUserData = (void *)0x0;
    IVar19 = pIVar11->Pos;
    IVar1 = pIVar11->Size;
    (pIVar5->NextWindowData).Flags = (pIVar5->NextWindowData).Flags | 0x11;
    (pIVar5->NextWindowData).PosVal.x = IVar1.x * 0.5 + IVar19.x;
    (pIVar5->NextWindowData).PosVal.y = IVar1.y * 0.5 + IVar19.y;
    (pIVar5->NextWindowData).PosPivotVal.x = 0.5;
    (pIVar5->NextWindowData).PosPivotVal.y = 0.5;
    (pIVar5->NextWindowData).PosCond = 1;
    (pIVar5->NextWindowData).PosUndock = true;
    IVar19 = (pIVar6->Style).WindowPadding;
    fVar20 = IVar19.x;
    fVar23 = IVar19.y;
    local_38.x = fVar20 + fVar20;
    local_38.y = fVar23 + fVar23;
    PushStyleVar(2,&local_38);
    Begin("###NavWindowingList",(bool *)0x0,0xc1347);
    iVar17 = (pIVar6->WindowsFocusOrder).Size;
    while (0 < iVar17) {
      iVar17 = iVar17 + -1;
      ppIVar13 = ImVector<ImGuiWindow_*>::operator[](&pIVar6->WindowsFocusOrder,iVar17);
      pIVar12 = *ppIVar13;
      if (pIVar12 == (ImGuiWindow *)0x0) {
        __assert_fail("window != __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                      ,0x2d67,"void ImGui::NavUpdateWindowingOverlay()");
      }
      bVar7 = IsWindowNavFocusable(pIVar12);
      if (bVar7) {
        text = pIVar12->Name;
        pcVar14 = FindRenderedTextEnd(text,(char *)0x0);
        label = text;
        if (text == pcVar14) {
          label = "(Popup)";
          if (((uint)pIVar12->Flags >> 0x1a & 1) == 0) {
            if (((uint)pIVar12->Flags >> 10 & 1) != 0) {
              iVar10 = strcmp(text,"##MainMenuBar");
              label = "(Main menu bar)";
              if (iVar10 == 0) goto LAB_0014df3f;
            }
            label = "(Dock node)";
            if (pIVar12->DockNodeAsHost == (ImGuiDockNode *)0x0) {
              label = "(Untitled)";
            }
          }
        }
LAB_0014df3f:
        local_38.x = 0.0;
        local_38.y = 0.0;
        Selectable(label,pIVar6->NavWindowingTarget == pIVar12,0,&local_38);
      }
    }
    End();
    PopStyleVar(1);
  }
  if (((pIVar6->NavWindow != (ImGuiWindow *)0x0) &&
      (bVar7 = NavMoveRequestButNoResultYet(), pIVar5 = GImGui, bVar7)) &&
     (-1 < (char)pIVar6->NavMoveFlags && (pIVar6->NavMoveFlags & 0xfU) != 0)) {
    pIVar12 = GImGui->NavWindow;
    IVar2 = GImGui->NavLayer;
    fVar23 = pIVar12->NavRectRel[IVar2].Min.x;
    fVar20 = pIVar12->NavRectRel[IVar2].Min.y;
    fVar18 = pIVar12->NavRectRel[IVar2].Max.x;
    fVar21 = pIVar12->NavRectRel[IVar2].Max.y;
    iVar17 = GImGui->NavMoveDir;
    move_flags = GImGui->NavMoveFlags;
    if (iVar17 == 0) {
      iVar10 = 0;
      clip_dir = 0;
      if ((move_flags & 5) == 0) {
        bVar7 = false;
      }
      else {
        fVar23 = (pIVar12->ContentSize).x + (pIVar12->WindowPadding).x;
        bVar7 = true;
        if ((move_flags & 4) == 0) goto LAB_0014e068;
        fVar18 = fVar21 - fVar20;
        fVar20 = fVar20 - fVar18;
        fVar21 = fVar21 - fVar18;
        clip_dir = 2;
        fVar18 = fVar23;
      }
    }
    else if (iVar17 == 1 && (move_flags & 5) != 0) {
      fVar23 = -(pIVar12->WindowPadding).x;
      if ((move_flags & 4) == 0) {
        iVar10 = 1;
      }
      else {
        fVar18 = fVar21 - fVar20;
        fVar20 = fVar20 + fVar18;
        fVar21 = fVar21 + fVar18;
        iVar10 = 3;
      }
LAB_0014e068:
      bVar7 = true;
      clip_dir = iVar10;
      fVar18 = fVar23;
    }
    else {
      bVar7 = false;
      clip_dir = iVar17;
    }
    if ((move_flags & 10) == 0 || iVar17 != 2) {
      if (iVar17 == 3 && (move_flags & 10) != 0) {
        fVar21 = -(pIVar12->WindowPadding).y;
        fVar20 = fVar21;
        if ((move_flags & 8) != 0) {
          fVar24 = fVar18 - fVar23;
          fVar23 = fVar23 + fVar24;
          fVar18 = fVar18 + fVar24;
          clip_dir = 1;
        }
      }
      else if (!bVar7) goto LAB_0014e10d;
    }
    else {
      fVar21 = (pIVar12->ContentSize).y + (pIVar12->WindowPadding).y;
      fVar20 = fVar21;
      if ((move_flags & 8) != 0) {
        fVar24 = fVar18 - fVar23;
        fVar23 = fVar23 - fVar24;
        fVar18 = fVar18 - fVar24;
        clip_dir = 0;
      }
    }
    pIVar12->NavRectRel[IVar2].Min.x = fVar23;
    pIVar12->NavRectRel[IVar2].Min.y = fVar20;
    pIVar12->NavRectRel[IVar2].Max.x = fVar18;
    pIVar12->NavRectRel[IVar2].Max.y = fVar21;
    NavMoveRequestForward(iVar17,clip_dir,move_flags,pIVar5->NavMoveScrollFlags);
  }
LAB_0014e10d:
  DockContextEndFrame(ctx);
  pIVar6 = GImGui;
  if (GImGui->CurrentViewport != (ImGuiViewportP *)0x0) {
    GImGui->CurrentDpiScale = 1.0;
    pIVar6->CurrentViewport = (ImGuiViewportP *)0x0;
  }
  if (ctx->DragDropActive != true) goto LAB_0014e180;
  bVar7 = (ctx->DragDropPayload).Delivery;
  if ((ctx->DragDropPayload).DataFrameCount + 1 < ctx->FrameCount) {
    if ((ctx->DragDropSourceFlags & 0x20) == 0) {
      bVar8 = IsMouseDown(ctx->DragDropMouseButton);
      bVar8 = !bVar8;
      goto LAB_0014e172;
    }
  }
  else {
    bVar8 = false;
LAB_0014e172:
    if ((!bVar8) && (bVar7 == false)) goto LAB_0014e180;
  }
  ClearDragDrop();
LAB_0014e180:
  iVar17 = ctx->FrameCount;
  if (((ctx->DragDropActive == true) && (ctx->DragDropSourceFrameCount < iVar17)) &&
     ((ctx->DragDropSourceFlags & 1) == 0)) {
    ctx->DragDropWithinSource = true;
    SetTooltip("...");
    ctx->DragDropWithinSource = false;
    iVar17 = ctx->FrameCount;
  }
  ctx->WithinFrameScope = false;
  ctx->FrameCountEnded = iVar17;
  UpdateMouseMovingWindowEndFrame();
  pIVar6 = GImGui;
  this = &(GImGui->PlatformIO).Viewports;
  iVar17 = 0;
  ImVector<ImGuiViewport_*>::resize(this,0);
  this_00 = &pIVar6->Viewports;
  do {
    if (this_00->Size <= iVar17) {
      ppIVar16 = ImVector<ImGuiViewportP_*>::operator[](this_00,0);
      pIVar4 = *ppIVar16;
      (pIVar4->super_ImGuiViewport).PlatformRequestMove = false;
      (pIVar4->super_ImGuiViewport).PlatformRequestResize = false;
      (pIVar4->super_ImGuiViewport).PlatformRequestClose = false;
      this_01 = &ctx->WindowsTempSortBuffer;
      ImVector<ImGuiWindow_*>::resize(this_01,0);
      this_02 = &ctx->Windows;
      ImVector<ImGuiWindow_*>::reserve(this_01,(ctx->Windows).Size);
      for (iVar17 = 0; iVar17 != this_02->Size; iVar17 = iVar17 + 1) {
        ppIVar13 = ImVector<ImGuiWindow_*>::operator[](this_02,iVar17);
        pIVar12 = *ppIVar13;
        if ((pIVar12->Active != true) || ((pIVar12->Flags & 0x1000000) == 0)) {
          AddWindowToSortBuffer(this_01,pIVar12);
        }
      }
      if (this_01->Size == iVar17) {
        ImVector<ImGuiWindow_*>::swap(this_02,this_01);
        (ctx->IO).MetricsActiveWindows = ctx->WindowsActiveCount;
        ((ctx->IO).Fonts)->Locked = false;
        (ctx->IO).MouseWheel = 0.0;
        (ctx->IO).MouseWheelH = 0.0;
        ImVector<unsigned_short>::resize(&(ctx->IO).InputQueueCharacters,0);
        (ctx->IO).NavInputs[0x10] = 0.0;
        (ctx->IO).NavInputs[0x11] = 0.0;
        (ctx->IO).NavInputs[0x12] = 0.0;
        (ctx->IO).NavInputs[0x13] = 0.0;
        (ctx->IO).NavInputs[0xc] = 0.0;
        (ctx->IO).NavInputs[0xd] = 0.0;
        (ctx->IO).NavInputs[0xe] = 0.0;
        (ctx->IO).NavInputs[0xf] = 0.0;
        (ctx->IO).NavInputs[8] = 0.0;
        (ctx->IO).NavInputs[9] = 0.0;
        (ctx->IO).NavInputs[10] = 0.0;
        (ctx->IO).NavInputs[0xb] = 0.0;
        (ctx->IO).NavInputs[4] = 0.0;
        (ctx->IO).NavInputs[5] = 0.0;
        (ctx->IO).NavInputs[6] = 0.0;
        (ctx->IO).NavInputs[7] = 0.0;
        (ctx->IO).NavInputs[0] = 0.0;
        (ctx->IO).NavInputs[1] = 0.0;
        (ctx->IO).NavInputs[2] = 0.0;
        (ctx->IO).NavInputs[3] = 0.0;
        CallContextHooks(ctx,ImGuiContextHookType_EndFramePost);
        return;
      }
      __assert_fail("g.Windows.Size == g.WindowsTempSortBuffer.Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                    ,0x13f9,"void ImGui::EndFrame()");
    }
    pIVar15 = (ImVec2 *)ImVector<ImGuiViewportP_*>::operator[](this_00,iVar17);
    IVar19 = *pIVar15;
    *(ImVec2 *)((long)IVar19 + 0x6c) = *(ImVec2 *)((long)IVar19 + 8);
    if ((*(int *)((long)IVar19 + 0x60) < pIVar6->FrameCount) ||
       (((ImVec2 *)((long)IVar19 + 0x10))->x <= 0.0)) {
      if (iVar17 == 0) {
        pIVar12 = *(ImGuiWindow **)((long)IVar19 + 0x80);
        if (pIVar12 != (ImGuiWindow *)0x0) goto LAB_0014e25b;
        goto LAB_0014e26d;
      }
    }
    else if ((iVar17 == 0) || (0.0 < *(float *)((long)IVar19 + 0x14))) {
      pIVar12 = *(ImGuiWindow **)((long)IVar19 + 0x80);
      if (pIVar12 == (ImGuiWindow *)0x0) {
        if (iVar17 != 0) {
          __assert_fail("viewport->Window != __null",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                        ,0x327f,"void ImGui::UpdateViewportsEndFrame()");
        }
      }
      else {
LAB_0014e25b:
        if ((pIVar12->Active != true) || (pIVar12->Hidden != false)) goto LAB_0014e27c;
      }
LAB_0014e26d:
      local_38 = IVar19;
      ImVector<ImGuiViewport_*>::push_back(this,(ImGuiViewport **)&local_38);
    }
LAB_0014e27c:
    iVar17 = iVar17 + 1;
  } while( true );
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    // Don't process EndFrame() multiple times.
    if (g.FrameCountEnded == g.FrameCount)
        return;
    IM_ASSERT(g.WithinFrameScope && "Forgot to call ImGui::NewFrame()?");

    CallContextHooks(&g, ImGuiContextHookType_EndFramePre);

    ErrorCheckEndFrameSanityChecks();

    // Notify Platform/OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.IO.SetPlatformImeDataFn && memcmp(&g.PlatformImeData, &g.PlatformImeDataPrev, sizeof(ImGuiPlatformImeData)) != 0)
    {
        ImGuiViewport* viewport = FindViewportByID(g.PlatformImeViewport);
        g.IO.SetPlatformImeDataFn(viewport ? viewport : GetMainViewport(), &g.PlatformImeData);
    }

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.WithinFrameScopeWithImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Update navigation: CTRL+Tab, wrap-around requests
    NavEndFrame();

    // Update docking
    DockContextEndFrame(&g);

    SetCurrentViewport(NULL, NULL);

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
    {
        g.DragDropWithinSource = true;
        SetTooltip("...");
        g.DragDropWithinSource = false;
    }

    // End frame
    g.WithinFrameScope = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Update user-facing viewport list (g.Viewports -> g.PlatformIO.Viewports after filtering out some)
    UpdateViewportsEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because children may not exist yet
    g.WindowsTempSortBuffer.resize(0);
    g.WindowsTempSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsTempSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsTempSortBuffer.Size);
    g.Windows.swap(g.WindowsTempSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));

    CallContextHooks(&g, ImGuiContextHookType_EndFramePost);
}